

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_teebuf.hpp
# Opt level: O2

int_type __thiscall
OpenMD::basic_teebuf<char,_std::char_traits<char>_>::overflow
          (basic_teebuf<char,_std::char_traits<char>_> *this,int_type c)

{
  int iVar1;
  pointer ppbVar2;
  
  if (c != -1) {
    ppbVar2 = (this->buffers_).
              super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppbVar2 ==
          (this->buffers_).
          super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return c;
      }
      iVar1 = std::streambuf::sputc((char)*ppbVar2);
      ppbVar2 = ppbVar2 + 1;
    } while (iVar1 != -1);
  }
  return -1;
}

Assistant:

int_type overflow(int_type c = traits_type::eof()) {
      // avoid writing eof to stream
      if (c == traits_type::eof()) { return traits_type::eof(); }

      typename std::vector<streambuf_type*>::iterator
          iter;  // typename is needed since it's a dependant name
      for (iter = buffers_.begin(); iter != buffers_.end(); ++iter) {
        if ((*iter)->sputc(c) == traits_type::eof()) {
          return traits_type::eof();
        }
      }

      return traits_type::not_eof(c);
    }